

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::OverridePrimSpec(PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  bool bVar1;
  Specifier *pSVar2;
  ostream *poVar3;
  string local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  string *err_local;
  string *warn_local;
  PrimSpec *src_local;
  PrimSpec *dst_local;
  
  pSVar2 = PrimSpec::specifier(src);
  if (*pSVar2 != Over) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"OverridePrimSpec");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x534);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1a0,
                               "src PrimSpec must be qualified with `over` specifier.\n");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1c0);
      ::std::__cxx11::string::~string(local_1c0);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  bVar1 = detail::OverridePrimSpecRec(0,dst,src,warn,err);
  return bVar1;
}

Assistant:

bool OverridePrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                      std::string *err) {
  if (src.specifier() != Specifier::Over) {
    PUSH_ERROR("src PrimSpec must be qualified with `over` specifier.\n");
  }

  return detail::OverridePrimSpecRec(0, dst, src, warn, err);
}